

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_pileup_engine.cpp
# Opt level: O0

void __thiscall
BamTools::PileupEngine::PileupEnginePrivate::CreatePileupData(PileupEnginePrivate *this)

{
  bool bVar1;
  __normal_iterator<const_BamTools::BamAlignment_*,_std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>_>
  *in_RDI;
  const_iterator alEnd;
  const_iterator alIter;
  BamAlignment *in_stack_00000198;
  PileupEnginePrivate *in_stack_000001a0;
  vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_> *in_stack_ffffffffffffffc8
  ;
  __normal_iterator<const_BamTools::BamAlignment_*,_std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>_>
  in_stack_fffffffffffffff0;
  
  ClearOldData((PileupEnginePrivate *)in_stack_fffffffffffffff0._M_current);
  *(undefined4 *)&in_RDI[4]._M_current = *(undefined4 *)&in_RDI->_M_current;
  *(undefined4 *)((long)&in_RDI[4]._M_current + 4) = *(undefined4 *)((long)&in_RDI->_M_current + 4);
  std::vector<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>::clear
            ((vector<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_> *)
             0x1e56d5);
  std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>::begin
            (in_stack_ffffffffffffffc8);
  __gnu_cxx::
  __normal_iterator<BamTools::BamAlignment_const*,std::vector<BamTools::BamAlignment,std::allocator<BamTools::BamAlignment>>>
  ::__normal_iterator<BamTools::BamAlignment*>
            (in_RDI,(__normal_iterator<BamTools::BamAlignment_*,_std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>_>
                     *)in_stack_ffffffffffffffc8);
  std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>::end
            (in_stack_ffffffffffffffc8);
  __gnu_cxx::
  __normal_iterator<BamTools::BamAlignment_const*,std::vector<BamTools::BamAlignment,std::allocator<BamTools::BamAlignment>>>
  ::__normal_iterator<BamTools::BamAlignment*>
            (in_RDI,(__normal_iterator<BamTools::BamAlignment_*,_std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>_>
                     *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_BamTools::BamAlignment_*,_std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_BamTools::BamAlignment_*,_std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>_>
    ::operator*((__normal_iterator<const_BamTools::BamAlignment_*,_std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>_>
                 *)&stack0xfffffffffffffff0);
    ParseAlignmentCigar(in_stack_000001a0,in_stack_00000198);
    __gnu_cxx::
    __normal_iterator<const_BamTools::BamAlignment_*,_std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>_>
    ::operator++((__normal_iterator<const_BamTools::BamAlignment_*,_std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>_>
                  *)&stack0xfffffffffffffff0);
  }
  return;
}

Assistant:

void PileupEngine::PileupEnginePrivate::CreatePileupData()
{

    // remove any non-overlapping alignments
    ClearOldData();

    // set pileup refId, position to current markers
    CurrentPileupData.RefId = CurrentId;
    CurrentPileupData.Position = CurrentPosition;
    CurrentPileupData.PileupAlignments.clear();

    // parse CIGAR data in remaining alignments
    std::vector<BamAlignment>::const_iterator alIter = CurrentAlignments.begin();
    std::vector<BamAlignment>::const_iterator alEnd = CurrentAlignments.end();
    for (; alIter != alEnd; ++alIter) {
        ParseAlignmentCigar((*alIter));
    }
}